

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eoplus.hpp
# Opt level: O1

void __thiscall EOPlus::State::State(State *this)

{
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  (this->name)._M_string_length = 0;
  (this->name).field_2._M_local_buf[0] = '\0';
  this->has_desc = false;
  (this->desc)._M_dataplus._M_p = (pointer)&(this->desc).field_2;
  (this->desc)._M_string_length = 0;
  (this->desc).field_2._M_local_buf[0] = '\0';
  (this->rules).super__Deque_base<EOPlus::Rule,_std::allocator<EOPlus::Rule>_>._M_impl.
  super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->rules).super__Deque_base<EOPlus::Rule,_std::allocator<EOPlus::Rule>_>._M_impl.
  super__Deque_impl_data._M_map_size = 0;
  (this->rules).super__Deque_base<EOPlus::Rule,_std::allocator<EOPlus::Rule>_>._M_impl.
  super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->rules).super__Deque_base<EOPlus::Rule,_std::allocator<EOPlus::Rule>_>._M_impl.
  super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->rules).super__Deque_base<EOPlus::Rule,_std::allocator<EOPlus::Rule>_>._M_impl.
  super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->rules).super__Deque_base<EOPlus::Rule,_std::allocator<EOPlus::Rule>_>._M_impl.
  super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->rules).super__Deque_base<EOPlus::Rule,_std::allocator<EOPlus::Rule>_>._M_impl.
  super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->rules).super__Deque_base<EOPlus::Rule,_std::allocator<EOPlus::Rule>_>._M_impl.
  super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->rules).super__Deque_base<EOPlus::Rule,_std::allocator<EOPlus::Rule>_>._M_impl.
  super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->rules).super__Deque_base<EOPlus::Rule,_std::allocator<EOPlus::Rule>_>._M_impl.
  super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  std::_Deque_base<EOPlus::Rule,_std::allocator<EOPlus::Rule>_>::_M_initialize_map
            (&(this->rules).super__Deque_base<EOPlus::Rule,_std::allocator<EOPlus::Rule>_>,0);
  (this->actions).super__Deque_base<EOPlus::Action,_std::allocator<EOPlus::Action>_>._M_impl.
  super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->actions).super__Deque_base<EOPlus::Action,_std::allocator<EOPlus::Action>_>._M_impl.
  super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  (this->actions).super__Deque_base<EOPlus::Action,_std::allocator<EOPlus::Action>_>._M_impl.
  super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->actions).super__Deque_base<EOPlus::Action,_std::allocator<EOPlus::Action>_>._M_impl.
  super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->actions).super__Deque_base<EOPlus::Action,_std::allocator<EOPlus::Action>_>._M_impl.
  super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->actions).super__Deque_base<EOPlus::Action,_std::allocator<EOPlus::Action>_>._M_impl.
  super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->actions).super__Deque_base<EOPlus::Action,_std::allocator<EOPlus::Action>_>._M_impl.
  super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->actions).super__Deque_base<EOPlus::Action,_std::allocator<EOPlus::Action>_>._M_impl.
  super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->actions).super__Deque_base<EOPlus::Action,_std::allocator<EOPlus::Action>_>._M_impl.
  super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->actions).super__Deque_base<EOPlus::Action,_std::allocator<EOPlus::Action>_>._M_impl.
  super__Deque_impl_data._M_map_size = 0;
  std::_Deque_base<EOPlus::Action,_std::allocator<EOPlus::Action>_>::_M_initialize_map
            (&(this->actions).super__Deque_base<EOPlus::Action,_std::allocator<EOPlus::Action>_>,0);
  this->goal_rule = 0;
  return;
}

Assistant:

State()
			: has_desc(false)
			, goal_rule(0)
		{ }